

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

void __thiscall bssl::Vector<bssl::ALPSConfig>::~Vector(Vector<bssl::ALPSConfig> *this)

{
  Vector<bssl::ALPSConfig> *this_local;
  
  clear(this);
  return;
}

Assistant:

~Vector() { clear(); }